

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30f402::CNNConvolveTest::RunCNNConvolveSetup(CNNConvolveTest *this,int run_times)

{
  bool bVar1;
  uint32_t uVar2;
  undefined4 in_ESI;
  int i_1;
  float *temp_ptr2;
  float *temp_ptr1;
  AssertionResult gtest_ar_2;
  float *out_data_mod;
  AssertionResult gtest_ar_1;
  float *out_data_ref;
  int j;
  int i;
  AssertionResult gtest_ar;
  float *temp_ptr;
  float *input_data;
  float *output_mod [20];
  float *output_ref [20];
  float *input [20];
  int out_size;
  int in_size;
  int out_height;
  int out_width;
  int layer;
  CNN_CONFIG *cnn_config;
  int in_height;
  int in_width;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  undefined4 in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  int in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  char *in_stack_fffffffffffffcb8;
  int line;
  char *in_stack_fffffffffffffcc0;
  Type in_stack_fffffffffffffccc;
  AssertHelper *in_stack_fffffffffffffcd0;
  int local_304;
  void *local_300;
  void *local_2f8;
  Message *in_stack_fffffffffffffd18;
  AssertHelper *in_stack_fffffffffffffd20;
  AssertionResult local_2d8;
  void *local_2c8;
  undefined8 local_2b0;
  AssertionResult local_2a8;
  void *local_298;
  int local_28c;
  int local_288;
  uint local_284;
  undefined8 local_260;
  AssertionResult local_258;
  float *local_248;
  float *local_240;
  char local_238 [72];
  CNN_LAYER_CONFIG *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  float **in_stack_fffffffffffffe28;
  CNNConvolveTest *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  float **in_stack_fffffffffffffe70;
  float **in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe80;
  undefined8 local_f8 [21];
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  CNN_CONFIG *local_38;
  int local_2c;
  int local_28;
  undefined4 local_24;
  
  local_28 = 0x41;
  local_2c = 0x41;
  local_38 = &av1_intra_mode_cnn_partition_cnn_config;
  local_3c = 0;
  local_24 = in_ESI;
  while( true ) {
    if (local_38->num_layers <= local_3c) {
      return;
    }
    local_40 = 0;
    local_44 = 0;
    local_48 = local_28 * local_2c;
    av1_find_cnn_layer_output_size
              (local_2c,local_28,local_38->layer_config + local_3c,&local_40,&local_44);
    local_4c = local_40 * local_44;
    local_248 = (float *)aom_malloc(0x4ed6c1);
    local_260 = 0;
    local_240 = local_248;
    testing::internal::CmpHelperNE<float*,decltype(nullptr)>
              (in_stack_fffffffffffffcb8,
               (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               (float **)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
               (void **)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_258);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffcd0);
      testing::AssertionResult::failure_message((AssertionResult *)0x4ed744);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,in_stack_fffffffffffffcc0,
                 (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      testing::Message::~Message((Message *)0x4ed7a1);
    }
    local_284 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x4ed828);
    if (local_284 != 0) break;
    for (local_288 = 0; local_288 < local_38->layer_config[local_3c].in_channels;
        local_288 = local_288 + 1) {
      local_f8[local_288] = local_248;
      for (local_28c = 0; local_28c < local_48; local_28c = local_28c + 1) {
        uVar2 = libaom_test::ACMRandom::Rand31((ACMRandom *)0x4ed8b0);
        *local_248 = ((float)uVar2 - 1.0737418e+09) / 2.1474836e+09;
        local_248 = local_248 + 1;
      }
    }
    local_298 = aom_calloc(CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                           CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    local_2b0 = 0;
    testing::internal::CmpHelperNE<float*,decltype(nullptr)>
              (in_stack_fffffffffffffcb8,
               (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               (float **)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
               (void **)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffcd0);
      testing::AssertionResult::failure_message((AssertionResult *)0x4ed9cd);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,in_stack_fffffffffffffcc0,
                 (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      testing::Message::~Message((Message *)0x4eda2a);
    }
    local_284 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x4edab1);
    if (local_284 != 0) {
      return;
    }
    local_2c8 = aom_calloc(CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                           CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    in_stack_fffffffffffffd20 = (AssertHelper *)0x0;
    testing::internal::CmpHelperNE<float*,decltype(nullptr)>
              (in_stack_fffffffffffffcb8,
               (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               (float **)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
               (void **)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    line = (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffcd0);
      testing::AssertionResult::failure_message((AssertionResult *)0x4edb7b);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc,in_stack_fffffffffffffcc0,line,
                 (char *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      testing::Message::~Message((Message *)0x4edbcf);
    }
    local_284 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x4edc53);
    if (local_284 != 0) {
      return;
    }
    local_2f8 = local_298;
    local_300 = local_2c8;
    for (local_304 = 0; local_304 < local_38->layer_config[local_3c].out_channels;
        local_304 = local_304 + 1) {
      *(void **)(&stack0xfffffffffffffe68 + (long)local_304 * 8) = local_2f8;
      *(void **)(local_238 + (long)local_304 * 8) = local_300;
      local_2f8 = (void *)((long)local_2f8 + (long)local_4c * 4);
      local_300 = (void *)((long)local_300 + (long)local_4c * 4);
    }
    in_stack_fffffffffffffcb8 = &stack0xfffffffffffffe68;
    in_stack_fffffffffffffcc0 = local_238;
    in_stack_fffffffffffffca0 = 1;
    in_stack_fffffffffffffca8 = local_24;
    in_stack_fffffffffffffcb0 = local_3c;
    RunCNNConvolveTest(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24
                       ,in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                       in_stack_fffffffffffffe10,in_stack_fffffffffffffe50,in_stack_fffffffffffffe58
                       ,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,
                       in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,in_stack_fffffffffffffe80
                      );
    local_28 = local_40;
    local_2c = local_44;
    aom_free((void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    aom_free((void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    aom_free((void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    local_3c = local_3c + 1;
  }
  return;
}

Assistant:

void RunCNNConvolveSetup(int run_times) {
    int in_width = 65;
    int in_height = 65;

    const CNN_CONFIG *cnn_config = &av1_intra_mode_cnn_partition_cnn_config;

    for (int layer = 0; layer < cnn_config->num_layers; ++layer) {
      int out_width = 0, out_height = 0;
      int in_size = in_width * in_height;
      // Get current layer output width and height.
      av1_find_cnn_layer_output_size(in_height, in_width,
                                     &cnn_config->layer_config[layer],
                                     &out_width, &out_height);

      int out_size = out_width * out_height;
      float *input[20], *output_ref[20], *output_mod[20];

      float *input_data =
          (float *)aom_malloc(sizeof(*input_data) * in_size *
                              cnn_config->layer_config[layer].in_channels);
      float *temp_ptr = input_data;
      ASSERT_NE(temp_ptr, nullptr);
      for (int i = 0; i < cnn_config->layer_config[layer].in_channels; ++i) {
        input[i] = temp_ptr;
        for (int j = 0; j < in_size; j++) {
          *(temp_ptr++) = ((float)rng_.Rand31() - (1 << 30)) / (1u << 31);
        }
      }

      float *out_data_ref = (float *)aom_calloc(
          sizeof(*out_data_ref),
          out_size * cnn_config->layer_config[layer].out_channels);
      ASSERT_NE(out_data_ref, nullptr);
      float *out_data_mod = (float *)aom_calloc(
          sizeof(*out_data_mod),
          out_size * cnn_config->layer_config[layer].out_channels);
      ASSERT_NE(out_data_mod, nullptr);
      float *temp_ptr1 = out_data_ref;
      float *temp_ptr2 = out_data_mod;
      for (int i = 0; i < cnn_config->layer_config[layer].out_channels; ++i) {
        output_ref[i] = temp_ptr1;
        output_mod[i] = temp_ptr2;
        temp_ptr1 += out_size;
        temp_ptr2 += out_size;
      }

      RunCNNConvolveTest(input, in_width, in_height, out_size,
                         &cnn_config->layer_config[layer], 0, 1, run_times,
                         layer, output_ref, output_mod, out_width);

      // Set current layer output width and height as next layer input width and
      // height.
      in_width = out_width;
      in_height = out_height;

      aom_free(input_data);
      aom_free(out_data_ref);
      aom_free(out_data_mod);
    }
  }